

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Pipeline::Pipeline(Pipeline *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Pipeline_003b8fa0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->models_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->models_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->models_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->models_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->names_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->names_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->names_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->names_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (Pipeline *)&_Pipeline_default_instance_) {
    protobuf_Model_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

Pipeline::Pipeline()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_Model_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.Pipeline)
}